

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* jsonnet::internal::jsonnet_vm_execute_stream
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,Allocator *alloc,AST *ast,ExtMap *ext_vars,uint max_stack,
            double gc_min_objects,double gc_growth_trigger,VmNativeCallbackMap *natives,
            JsonnetImportCallback *import_callback,void *ctx,bool string_output)

{
  HeapEntity *context;
  long lVar1;
  pointer pcVar2;
  LocationRange *pLVar3;
  Location *pLVar4;
  ostream *poVar5;
  RuntimeError *__return_storage_ptr___00;
  size_type *psVar6;
  Type t;
  _func_int **pp_Var7;
  LocationRange loc;
  stringstream ss;
  Interpreter vm;
  UString local_458;
  size_type *local_438;
  undefined8 uStack_430;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_428;
  UString local_420;
  _func_int **local_400;
  LocationRange local_3f8;
  string local_3b8;
  undefined1 local_398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  unsigned_long local_378;
  unsigned_long uStack_370;
  unsigned_long local_368;
  unsigned_long uStack_360;
  undefined1 local_210 [72];
  anon_union_8_3_4e909c26_for_v aStack_1c8;
  Stack local_1c0 [10];
  
  anon_unknown_0::Interpreter::Interpreter
            ((Interpreter *)local_210,alloc,ext_vars,max_stack,gc_min_objects,gc_growth_trigger,
             natives,import_callback,ctx);
  anon_unknown_0::Interpreter::evaluate((Interpreter *)local_210,ast,0);
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398._0_8_ = local_398 + 0x10;
  local_458._M_dataplus._M_p = (pointer)0x14;
  local_428 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              __return_storage_ptr__;
  local_398._0_8_ = std::__cxx11::string::_M_create((ulong *)local_398,(ulong)&local_458);
  local_388._M_allocated_capacity = (size_type)local_458._M_dataplus._M_p;
  builtin_strncpy((char *)local_398._0_8_,"During manifestation",0x14);
  local_398._8_8_ = local_458._M_dataplus._M_p;
  *(char *)(local_398._0_8_ + (long)local_458._M_dataplus._M_p) = '\0';
  local_3f8.file._M_dataplus._M_p = (pointer)&local_3f8.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8,local_398._0_8_,
             (char *)((long)local_458._M_dataplus._M_p + local_398._0_8_));
  local_3f8.end.line = 0;
  local_3f8.end.column = 0;
  local_3f8.begin.line = 0;
  local_3f8.begin.column = 0;
  if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,(ulong)(local_388._M_allocated_capacity + 1));
  }
  if (local_210._64_4_ != ARRAY) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_398);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_398 + 0x10),"stream mode: top-level object was a ",0x24);
    (anonymous_namespace)::type_str_abi_cxx11_
              ((string *)&local_458,(_anonymous_namespace_ *)(local_210._64_8_ & 0xffffffff),t);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_398 + 0x10),(char *)local_458._M_dataplus._M_p,
                        local_458._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"should be an array whose elements hold ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"the JSON for each document in the stream.",0x29);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,
                      (ulong)(local_458.field_2._M_allocated_capacity + 1));
    }
    __return_storage_ptr___00 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    anon_unknown_0::Stack::makeError
              (__return_storage_ptr___00,(Stack *)(local_210 + 0x50),&local_3f8,(string *)&local_458
              );
    __cxa_throw(__return_storage_ptr___00,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  pp_Var7 = aStack_1c8.h[1]._vptr_HeapEntity;
  local_400 = *(_func_int ***)&aStack_1c8.h[1].mark;
  if (pp_Var7 != local_400) {
    do {
      context = (HeapEntity *)*pp_Var7;
      lVar1 = *(long *)&context[6].mark;
      pLVar3 = (LocationRange *)(lVar1 + 8);
      if (lVar1 == 0) {
        pLVar3 = &local_3f8;
      }
      local_398._0_8_ = local_398 + 0x10;
      pcVar2 = (pLVar3->file)._M_dataplus._M_p;
      psVar6 = (size_type *)(lVar1 + 0x10);
      if (lVar1 == 0) {
        psVar6 = &local_3f8.file._M_string_length;
      }
      std::__cxx11::string::_M_construct<char*>((string *)local_398,pcVar2,pcVar2 + *psVar6);
      pLVar4 = (Location *)(lVar1 + 0x28);
      if (lVar1 == 0) {
        pLVar4 = &local_3f8.begin;
      }
      local_378 = pLVar4->line;
      uStack_370 = pLVar4->column;
      local_368 = pLVar4[1].line;
      uStack_360 = pLVar4[1].column;
      if (context->field_0xa == '\x01') {
        local_458.field_2._M_allocated_capacity = 0;
        local_458._M_dataplus._M_p = (pointer)0x0;
        local_458._M_string_length = 0;
        local_458.field_2._8_8_ = &local_458._M_string_length;
        uStack_430 = 0;
        pLVar3 = &local_3f8;
        local_438 = (size_type *)local_458.field_2._8_8_;
        anon_unknown_0::Stack::newCall
                  ((Stack *)(local_210 + 0x50),pLVar3,context,(HeapObject *)0x0,0,
                   (BindingFrame *)&local_458);
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)local_458.field_2._M_allocated_capacity,(_Link_type)pLVar3);
        *(undefined8 *)
         &local_1c0[0].stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].val = local_210._64_8_;
        local_1c0[0].stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].val.v.h = (HeapEntity *)aStack_1c8;
        local_210._64_8_ = context[1]._vptr_HeapEntity;
        aStack_1c8 = *(anon_union_8_3_4e909c26_for_v *)&context[1].mark;
      }
      else {
        anon_unknown_0::Stack::newCall
                  ((Stack *)(local_210 + 0x50),&local_3f8,context,*(HeapObject **)&context[5].mark,
                   *(uint *)&context[6]._vptr_HeapEntity,(BindingFrame *)&context[2].mark);
        *(undefined8 *)
         &local_1c0[0].stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].val = local_210._64_8_;
        local_1c0[0].stack.
        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].val.v.h = (HeapEntity *)aStack_1c8;
        anon_unknown_0::Interpreter::evaluate
                  ((Interpreter *)local_210,*(AST **)&context[6].mark,
                   (int)((ulong)((long)local_1c0[0].stack.
                                       super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1c0[0].stack.
                                      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x3d70a3d7
                  );
      }
      __return_storage_ptr__ =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_428;
      if (string_output) {
        (anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
                  (&local_458,(Interpreter *)local_210,(LocationRange *)local_398);
      }
      else {
        local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
        local_420._M_string_length = 0;
        local_420.field_2._M_local_buf[0] = L'\0';
        anon_unknown_0::Interpreter::manifestJson
                  (&local_458,(Interpreter *)local_210,(LocationRange *)local_398,true,&local_420);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_420._M_dataplus._M_p != &local_420.field_2) {
          operator_delete(local_420._M_dataplus._M_p,
                          CONCAT44(local_420.field_2._M_local_buf[1],
                                   local_420.field_2._M_local_buf[0]) * 4 + 4);
        }
      }
      local_210._64_8_ =
           *(undefined8 *)
            &local_1c0[0].stack.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].val;
      aStack_1c8 = local_1c0[0].stack.
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].val.v;
      if (local_1c0[0].stack.
          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].kind == FRAME_CALL) {
        local_1c0[0].calls = local_1c0[0].calls - 1;
      }
      local_1c0[0].stack.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1c0[0].stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      anon_unknown_0::Frame::~Frame
                (local_1c0[0].stack.
                 super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      encode_utf8(&local_3b8,&local_458);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity * 4 + 4);
      }
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_,(ulong)(local_388._M_allocated_capacity + 1));
      }
      pp_Var7 = pp_Var7 + 1;
    } while (pp_Var7 != local_400);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.file._M_dataplus._M_p != &local_3f8.file.field_2) {
    operator_delete(local_3f8.file._M_dataplus._M_p,local_3f8.file.field_2._M_allocated_capacity + 1
                   );
  }
  anon_unknown_0::Interpreter::~Interpreter((Interpreter *)local_210);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            __return_storage_ptr__;
}

Assistant:

std::vector<std::string> jsonnet_vm_execute_stream(Allocator *alloc, const AST *ast,
                                                   const ExtMap &ext_vars, unsigned max_stack,
                                                   double gc_min_objects, double gc_growth_trigger,
                                                   const VmNativeCallbackMap &natives,
                                                   JsonnetImportCallback *import_callback,
                                                   void *ctx, bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    return vm.manifestStream(string_output);
}